

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O0

BOOL Js::JavascriptConversion::ToInt32Finite(Var aValue,ScriptContext *scriptContext,int32 *result)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  int32 iVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptBoolean *this;
  JavascriptTypedNumber<long> *this_00;
  long lVar8;
  JavascriptTypedNumber<unsigned_long> *this_01;
  unsigned_long uVar9;
  JavascriptString *this_02;
  double dVar10;
  undefined1 auVar11 [16];
  ScriptContext *local_58;
  BOOL fPrimitiveOnly;
  ScriptContext *objectScriptContext;
  int32 *result_local;
  ScriptContext *scriptContext_local;
  Var aValue_local;
  TypeId local_18;
  TypeId typeId;
  
  bVar2 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar2) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    local_58 = RecyclableObject::GetScriptContext(pRVar7);
  }
  else {
    local_58 = (ScriptContext *)0x0;
  }
  bVar2 = false;
  scriptContext_local = (ScriptContext *)aValue;
LAB_00f71851:
  if (scriptContext_local == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(scriptContext_local);
  if (bVar3) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(scriptContext_local);
    if (bVar3) {
      local_18 = TypeIds_Number;
    }
    else {
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>(scriptContext_local);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(pRVar7);
      if ((0x57 < (int)local_18) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  switch(local_18) {
  case TypeIds_Null:
    *result = 0;
    aValue_local._4_4_ = 1;
    break;
  case TypeIds_Boolean:
    this = UnsafeVarTo<Js::JavascriptBoolean>(scriptContext_local);
    BVar4 = JavascriptBoolean::GetValue(this);
    *result = (uint)(BVar4 != 0);
    aValue_local._4_4_ = 1;
    break;
  case TypeIds_FirstNumberType:
    iVar5 = TaggedInt::ToInt32(scriptContext_local);
    *result = iVar5;
    aValue_local._4_4_ = 1;
    break;
  case TypeIds_Number:
    dVar10 = JavascriptNumber::GetValue(scriptContext_local);
    aValue_local._4_4_ = ToInt32Finite(dVar10,result);
    break;
  case TypeIds_Int64Number:
    this_00 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(scriptContext_local);
    lVar8 = JavascriptTypedNumber<long>::GetValue(this_00);
    aValue_local._4_4_ = ToInt32Finite((double)lVar8,result);
    break;
  case TypeIds_LastNumberType:
    this_01 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(scriptContext_local);
    uVar9 = JavascriptTypedNumber<unsigned_long>::GetValue(this_01);
    auVar11._8_4_ = (int)(uVar9 >> 0x20);
    auVar11._0_8_ = uVar9;
    auVar11._12_4_ = 0x45300000;
    aValue_local._4_4_ =
         ToInt32Finite((auVar11._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0),result);
    break;
  case TypeIds_String:
    this_02 = UnsafeVarTo<Js::JavascriptString>(scriptContext_local);
    dVar10 = JavascriptString::ToDouble(this_02);
    aValue_local._4_4_ = ToInt32Finite(dVar10,result);
    break;
  case TypeIds_Symbol:
    JavascriptError::TryThrowTypeError(local_58,scriptContext,-0x7ff5ec77,(PCWSTR)0x0);
  case TypeIds_Undefined:
    *result = 0;
    aValue_local._4_4_ = 0;
    break;
  default:
    goto LAB_00f71b75;
  }
  return aValue_local._4_4_;
LAB_00f71b75:
  BVar4 = Js::JavascriptOperators::IsObject(scriptContext_local);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x45d,"(JavascriptOperators::IsObject(aValue))",
                                "bad type object in conversion ToInteger32");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x460,"(0)",
                                "wrong call in ToInteger32_Full, no dynamic objects should get here"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
    JavascriptError::ThrowError(scriptContext,-0x7ff5fe4a,(PCWSTR)0x0);
  }
  bVar2 = true;
  scriptContext_local =
       (ScriptContext *)ToPrimitive<(Js::JavascriptHint)2>(scriptContext_local,scriptContext);
  goto LAB_00f71851;
}

Assistant:

BOOL JavascriptConversion::ToInt32Finite(Var aValue, ScriptContext* scriptContext, int32* result)
    {
        ScriptContext * objectScriptContext = VarIs<RecyclableObject>(aValue) ? UnsafeVarTo<RecyclableObject>(aValue)->GetScriptContext() : nullptr;
        BOOL fPrimitiveOnly = false;
        while(true)
        {
            switch (JavascriptOperators::GetTypeId(aValue))
            {
            case TypeIds_Symbol:
                JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
                // Fallthrough to return false and set result to 0 if exceptions are disabled
            case TypeIds_Undefined:
                *result = 0;
                return false;

            case TypeIds_Null:
                *result = 0;
                return true;

            case TypeIds_Integer:
                *result = TaggedInt::ToInt32(aValue);
                return true;

            case TypeIds_Boolean:
                *result = UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;
                return true;

            case TypeIds_Number:
                return ToInt32Finite(JavascriptNumber::GetValue(aValue), result);

            case TypeIds_Int64Number:
                // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
                // treat it as double anyhow.
                return ToInt32Finite((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue(), result);

            case TypeIds_UInt64Number:
                // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
                // treat it as double anyhow.
                return ToInt32Finite((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue(), result);

            case TypeIds_String:
                return ToInt32Finite(UnsafeVarTo<JavascriptString>(aValue)->ToDouble(), result);

            default:
                {
                    AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToInteger32");
                    if(fPrimitiveOnly)
                    {
                        AssertMsg(FALSE, "wrong call in ToInteger32_Full, no dynamic objects should get here");
                        JavascriptError::ThrowError(scriptContext, VBSERR_OLENoPropOrMethod);
                    }
                    fPrimitiveOnly = true;
                    aValue = ToPrimitive<JavascriptHint::HintNumber>(aValue, scriptContext);
                }
            }
        }
    }